

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O0

WeightConstraint *
Clasp::WeightConstraint::doCreate(Solver *s,Literal W,WeightLitsRep *rep,uint32 flags)

{
  bool bVar1;
  Literal LVar2;
  Literal LVar3;
  Literal LVar4;
  uint32 uVar5;
  uint uVar6;
  uint uVar7;
  SharedContext *pSVar8;
  WeightConstraint *pWVar9;
  uint in_ECX;
  WeightLitsRep *in_RDX;
  uint32 in_ESI;
  Solver *in_RDI;
  ClauseRep CVar10;
  Result RVar11;
  WeightConstraint *c;
  SharedContext *ctx;
  uint8 *t;
  WL *sL;
  void *m;
  uint32 wls;
  uint32 nb;
  uint32 size;
  bool hasW;
  size_type i;
  bool sat;
  bool disj;
  Literal bin [2];
  LitVec clause;
  bool addSat;
  uint32 act;
  uint32 onlyOne;
  WeightConstraint *conflict;
  undefined4 in_stack_fffffffffffffe28;
  uint32 in_stack_fffffffffffffe2c;
  Literal in_stack_fffffffffffffe30;
  __int_type in_stack_fffffffffffffe34;
  __atomic_base<unsigned_int> *in_stack_fffffffffffffe38;
  Solver *in_stack_fffffffffffffe40;
  ConstraintInfo *in_stack_fffffffffffffe48;
  WeightConstraint *this;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_fffffffffffffe50;
  LitVec *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Solver *in_stack_fffffffffffffe80;
  WeightLitsRep *in_stack_fffffffffffffe88;
  Literal in_stack_fffffffffffffe90;
  undefined1 isNew;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Literal *local_120;
  uint3 in_stack_fffffffffffffef8;
  uint uVar12;
  WeightLitsRep *in_stack_ffffffffffffff00;
  Solver *in_stack_ffffffffffffff10;
  ConstraintInfo local_b4;
  ClauseHead *local_b0;
  Status local_a8;
  undefined4 local_a0;
  ConstraintInfo local_9c;
  ClauseRep local_98;
  uint32 local_88;
  uint32 local_84;
  uint32 local_80;
  uint32 local_7c;
  uint32 local_78;
  uint local_74;
  uint32 local_70;
  uint32 local_6c;
  byte local_66;
  undefined1 local_65;
  Literal local_64;
  uint32 local_60;
  Literal aLStack_5c [3];
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> local_50;
  uint32 local_40;
  byte local_39;
  uint local_38;
  undefined4 local_34;
  WeightConstraint *local_30;
  uint local_24;
  WeightLitsRep *local_20;
  Solver *local_18;
  Literal local_c;
  WeightConstraint *local_8;
  
  local_30 = (WeightConstraint *)0x1;
  local_34 = 0xc0;
  local_38 = 3;
  if (((in_ECX & 0xc0) != 0) && ((in_ECX & 0xc0) != 0xc0)) {
    local_38 = (uint)((in_ECX & 0x80) != 0);
  }
  uVar12 = (uint)in_stack_fffffffffffffef8;
  if ((in_ECX & 4) != 0) {
    uVar12 = CONCAT13(in_RDX->size != 0,in_stack_fffffffffffffef8);
  }
  local_39 = (byte)(uVar12 >> 0x18);
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RDI;
  local_c.rep_ = in_ESI;
  Literal::var(&local_c);
  Solver::acquireProblemVar
            (in_stack_fffffffffffffe40,(Var)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  local_40 = local_c.rep_;
  bVar1 = WeightLitsRep::propagate
                    (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe90);
  if (!bVar1) {
    return local_30;
  }
  bVar1 = WeightLitsRep::unsat(local_20);
  if ((bVar1) || ((bVar1 = WeightLitsRep::sat(local_20), bVar1 && ((local_39 & 1) == 0)))) {
    return (WeightConstraint *)0x0;
  }
  if ((((local_20->bound != 1) && (local_20->bound != local_20->reach)) || ((local_24 & 1) != 0)) ||
     (local_38 != 3)) {
    pSVar8 = Solver::sharedContext(local_18);
    bVar1 = SharedContext::physicalShareProblem(pSVar8);
    if (!bVar1) {
      local_24 = local_24 | 0x10;
    }
    pSVar8 = Solver::sharedContext(local_18);
    bVar1 = SharedContext::frozen(pSVar8);
    if (bVar1) {
      local_24 = local_24 | 0x18;
    }
    bVar1 = WeightLitsRep::hasWeights(local_20);
    uVar5 = local_20->size + 1;
    uVar6 = (uVar5 + bVar1) * 4 + 0x20;
    uVar7 = (uVar5 << bVar1) * 4 + 4;
    if ((local_24 & 0x10) == 0) {
      pWVar9 = (WeightConstraint *)operator_new((ulong)uVar6);
      in_stack_ffffffffffffff10 = (Solver *)operator_new((ulong)uVar7 + 4);
      std::__atomic_base<unsigned_int>::operator=
                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
      this = (WeightConstraint *)&in_stack_ffffffffffffff10->field_0x4;
      WL::WL((WL *)this,uVar5,true,bVar1);
    }
    else {
      pWVar9 = (WeightConstraint *)operator_new((ulong)(uVar6 + uVar7));
      this = (WeightConstraint *)((long)pWVar9->bound_ + ((ulong)uVar6 - 0x14));
      WL::WL((WL *)this,uVar5,false,bVar1);
    }
    if ((local_24 & 8) == 0) {
      pSVar8 = Solver::sharedContext(local_18);
    }
    else {
      pSVar8 = (SharedContext *)0x0;
    }
    uVar6 = local_38;
    WeightConstraint(this,in_stack_ffffffffffffff10,pSVar8,(Literal)(uint32)((ulong)pWVar9 >> 0x20),
                     in_stack_ffffffffffffff00,(WL *)CONCAT44(local_c.rep_,uVar12),uVar5);
    bVar1 = integrateRoot((WeightConstraint *)
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                          (Solver *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    if (!bVar1) {
      (*(pWVar9->super_Constraint)._vptr_Constraint[5])(pWVar9,local_18,1);
      return local_30;
    }
    if ((local_24 & 3) != 0) {
      return pWVar9;
    }
    Solver::add((Solver *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30.rep_),
                (Constraint *)CONCAT44(in_stack_fffffffffffffe2c,uVar6));
    return pWVar9;
  }
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            (in_stack_fffffffffffffe50);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::reserve
            (in_stack_fffffffffffffe50,(size_type)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  local_120 = &local_64;
  do {
    Literal::Literal(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != aLStack_5c);
  local_65 = local_20->bound == 1;
  local_66 = 0;
  local_70 = local_c.rep_;
  local_6c = (uint32)operator^(in_stack_fffffffffffffe30,SUB41(in_stack_fffffffffffffe2c >> 0x18,0))
  ;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
             in_stack_fffffffffffffe40,(Literal *)in_stack_fffffffffffffe38);
  for (local_74 = 0; uVar5 = (uint32)((ulong)in_stack_fffffffffffffe50 >> 0x20),
      local_74 != local_20->size; local_74 = local_74 + 1) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[](&local_50,0);
    LVar2 = Literal::operator~((Literal *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_80 = local_20->lits[local_74].first.rep_;
    local_78 = LVar2.rep_;
    local_64 = LVar2;
    LVar3 = operator^(in_stack_fffffffffffffe30,SUB41(in_stack_fffffffffffffe2c >> 0x18,0));
    isNew = (undefined1)((ulong)&local_64 >> 0x38);
    local_7c = LVar3.rep_;
    local_60 = LVar3.rep_;
    LVar4 = Literal::operator~((Literal *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_84 = LVar4.rep_;
    bVar1 = Clasp::operator!=((Literal *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30.rep_),
                              (Literal *)
                              CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    if (bVar1) {
      bVar1 = Clasp::operator!=((Literal *)
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30.rep_),
                                (Literal *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar1) {
        local_88 = (uint32)Literal::operator~((Literal *)
                                              CONCAT44(in_stack_fffffffffffffe2c,
                                                       in_stack_fffffffffffffe28));
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                   in_stack_fffffffffffffe40,(Literal *)in_stack_fffffffffffffe38);
      }
      ConstraintInfo::ConstraintInfo(&local_9c,Static);
      CVar10 = ClauseRep::create((Literal *)
                                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30.rep_),
                                 in_stack_fffffffffffffe2c,(Info *)0x2160b0);
      local_98 = CVar10;
      bVar1 = Solver::add((Solver *)CONCAT44(LVar2.rep_,LVar3.rep_),
                          (ClauseRep *)CONCAT44(LVar4.rep_,in_stack_fffffffffffffeb0),(bool)isNew);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_8 = local_30;
        goto LAB_00216215;
      }
    }
    else {
      local_66 = 1;
    }
  }
  if ((local_66 & 1) == 0) {
    ConstraintInfo::ConstraintInfo(&local_b4,Static);
    RVar11 = ClauseCreator::create
                       ((Solver *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58,uVar5,in_stack_fffffffffffffe48);
    local_b0 = RVar11.local;
    local_a8 = RVar11.status;
    bVar1 = ClauseCreator::Result::operator_cast_to_bool((Result *)0x2161d7);
    local_8 = local_30;
    if (!bVar1) goto LAB_00216215;
  }
  local_8 = (WeightConstraint *)0x0;
LAB_00216215:
  local_a0 = 1;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x216222);
  return local_8;
}

Assistant:

WeightConstraint* WeightConstraint::doCreate(Solver& s, Literal W, WeightLitsRep& rep, uint32 flags) {
	WeightConstraint* conflict = (WeightConstraint*)0x1;
	const uint32 onlyOne = create_only_btb|create_only_bfb;
	uint32 act  = 3u;
	if ((flags & onlyOne) && (flags & onlyOne) != onlyOne) {
		act = (flags & create_only_bfb) != 0u;
	}
	bool addSat = (flags&create_sat) != 0 && rep.size;
	s.acquireProblemVar(W.var());
	if (!rep.propagate(s, W))                 { return conflict; }
	if (rep.unsat() || (rep.sat() && !addSat)){ return 0; }
	if ((rep.bound == 1 || rep.bound == rep.reach) && (flags & create_explicit) == 0 && act == 3u) {
		LitVec clause; clause.reserve(1 + rep.size);
		Literal bin[2];
		bool disj = rep.bound == 1; // con == disjunction or con == conjunction
		bool sat  = false;
		clause.push_back(W ^ disj);
		for (LitVec::size_type i = 0; i != rep.size; ++i) {
			bin[0] = ~clause[0];
			bin[1] = rep.lits[i].first ^ disj;
			if (bin[0] != ~bin[1]) {
				if (bin[0] != bin[1])                 { clause.push_back(~bin[1]); }
				if (!s.add(ClauseRep::create(bin, 2))){ return conflict; }
			}
			else { sat = true; }
		}
		return (sat || ClauseCreator::create(s, clause, 0)) ? 0 : conflict;
	}
	assert(rep.open() || (rep.sat() && addSat));
	if (!s.sharedContext()->physicalShareProblem()) { flags |= create_no_share; }
	if (s.sharedContext()->frozen())                { flags |= (create_no_freeze|create_no_share); }
	bool   hasW = rep.hasWeights();
	uint32 size = 1 + rep.size;
	uint32 nb   = sizeof(WeightConstraint) + (size+uint32(hasW))*sizeof(UndoInfo);
	uint32 wls  = sizeof(WL) + (size << uint32(hasW))*sizeof(Literal);
	void*  m    = 0;
	WL*    sL   = 0;
	if ((flags & create_no_share) != 0) {
		nb = ((nb + 3) / 4)*4;
		m  = ::operator new (nb + wls);
		sL = new (reinterpret_cast<unsigned char*>(m)+nb) WL(size, false, hasW);
	}
	else {
		static_assert(sizeof(RCType) == sizeof(uint32), "Invalid size!");
		m = ::operator new(nb);
		uint8* t = (uint8*)::operator new(wls + sizeof(uint32));
		*(new (t) RCType) = 1;
		sL = new (t+sizeof(uint32)) WL(size, true, hasW);
	}
	assert(m && (reinterpret_cast<uintp>(m) & 7u) == 0);
	SharedContext*  ctx = (flags & create_no_freeze) == 0 ? const_cast<SharedContext*>(s.sharedContext()) : 0;
	WeightConstraint* c = new (m) WeightConstraint(s, ctx, W, rep, sL, act);
	if (!c->integrateRoot(s)) {
		c->destroy(&s, true);
		return conflict;
	}
	if ((flags & create_no_add) == 0) { s.add(c); }
	return c;
}